

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall helics::apps::Player::cleanUpPointList(Player *this)

{
  bool bVar1;
  reference pMVar2;
  mapped_type *pmVar3;
  long in_RDI;
  MessageHolder *ms;
  iterator __end2_1;
  iterator __begin2_1;
  vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *__range2_1;
  ValueSetter *vs;
  iterator __end2;
  iterator __begin2;
  vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *__range2;
  key_type *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
  local_48;
  long local_40;
  __sv_type local_38;
  reference local_28;
  ValueSetter *local_20;
  __normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RDI + 0xa0;
  local_18._M_current =
       (ValueSetter *)
       CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
       begin((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
             in_stack_ffffffffffffff78);
  local_20 = (ValueSetter *)
             CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ::end((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
                   in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
                      ((__normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
                        *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_28 = __gnu_cxx::
               __normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
               ::operator*(&local_18);
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff80);
    pmVar3 = CLI::std::
             unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_28->index = *pmVar3;
    __gnu_cxx::
    __normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
    ::operator++(&local_18);
  }
  local_40 = in_RDI + 0xb8;
  local_48._M_current =
       (MessageHolder *)
       CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
       begin((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
             in_stack_ffffffffffffff78);
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::end
            ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
             in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
                      ((__normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
                        *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pMVar2 = __gnu_cxx::
             __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
             ::operator*(&local_48);
    in_stack_ffffffffffffff80 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x210);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff80);
    pmVar3 = CLI::std::
             unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pMVar2->index = *pmVar3;
    __gnu_cxx::
    __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

void Player::cleanUpPointList()
{
    // load up the indexes
    for (auto& vs : points) {
        vs.index = pubids[vs.pubName];
    }
    /** load the indices for the message*/
    for (auto& ms : messages) {
        ms.index = eptids[ms.mess.source];
    }
}